

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

CharCount __thiscall
UnifiedRegex::MatchLiteralNode::EmitScan
          (MatchLiteralNode *this,Compiler *compiler,bool isHeadSyncronizingNode)

{
  code *pcVar1;
  bool bVar2;
  Scheme SVar3;
  char16_t **ppcVar4;
  Char *pat;
  undefined4 *puVar5;
  SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *this_00;
  SyncToLiteralEquivAndConsumeInst *this_01;
  SyncToCharAndConsumeInst *this_02;
  SyncToChar2LiteralAndConsumeInst *this_03;
  SyncToLinearLiteralAndConsumeInst *this_04;
  SyncToLiteralAndConsumeInst *this_05;
  SyncToLiteralEquivTrivialLastPatCharAndContinueInst *this_06;
  SyncToLiteralEquivAndContinueInst *this_07;
  SyncToCharAndContinueInst *this_08;
  SyncToChar2LiteralAndContinueInst *this_09;
  SyncToLinearLiteralAndContinueInst *this_10;
  SyncToLiteralAndContinueInst *this_11;
  SyncToLiteralEquivTrivialLastPatCharAndBackupInst *this_12;
  SyncToLiteralEquivAndBackupInst *this_13;
  SyncToCharAndBackupInst *this_14;
  SyncToChar2LiteralAndBackupInst *this_15;
  SyncToLinearLiteralAndBackupInst *this_16;
  SyncToLiteralAndBackupInst *this_17;
  undefined1 local_d8 [8];
  TextbookBoyerMooreSetup<char16_t> setup_2;
  undefined1 local_a0 [4];
  uint lastPatCharIndex_2;
  TextbookBoyerMooreSetup<char16_t> setup_1;
  undefined1 local_68 [4];
  uint lastPatCharIndex_1;
  TextbookBoyerMooreSetup<char16_t> setup;
  uint lastPatCharIndex;
  Char *litptr;
  bool isHeadSyncronizingNode_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  
  ppcVar4 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                      ((WriteBarrierPtr *)&(compiler->program->rep).insts.litbuf);
  pat = *ppcVar4 + this->offset;
  if (isHeadSyncronizingNode) {
    bVar2 = CountDomain::IsExact(&(this->super_Node).prevConsumes,0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x3e1,"(prevConsumes.IsExact(0))","prevConsumes.IsExact(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((this->isEquivClass & 1U) == 0) {
      if (this->length == 1) {
        this_02 = (SyncToCharAndConsumeInst *)Compiler::Emit(compiler,3);
        SyncToCharAndConsumeInst::SyncToCharAndConsumeInst(this_02,*pat);
      }
      else if (this->length == 2) {
        this_03 = (SyncToChar2LiteralAndConsumeInst *)Compiler::Emit(compiler,5);
        SyncToChar2LiteralAndConsumeInst::SyncToChar2LiteralAndConsumeInst(this_03,*pat,pat[1]);
      }
      else {
        TextbookBoyerMooreSetup<char16_t>::TextbookBoyerMooreSetup
                  ((TextbookBoyerMooreSetup<char16_t> *)local_68,pat,this->length);
        SVar3 = TextbookBoyerMooreSetup<char16_t>::GetScheme
                          ((TextbookBoyerMooreSetup<char16_t> *)local_68);
        if (SVar3 == DefaultScheme) {
          this_05 = (SyncToLiteralAndConsumeInst *)Compiler::Emit(compiler,0x449);
          SyncToLiteralAndConsumeInst::SyncToLiteralAndConsumeInst
                    (this_05,this->offset,this->length);
          TextbookBoyerMoore<char16_t>::Setup
                    (&(this_05->
                      super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                      ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.scanner,
                     compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_68);
        }
        else if (SVar3 == LinearScheme) {
          this_04 = (SyncToLinearLiteralAndConsumeInst *)Compiler::Emit(compiler,0x39);
          SyncToLinearLiteralAndConsumeInst::SyncToLinearLiteralAndConsumeInst
                    (this_04,this->offset,this->length);
          TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                    (&(this_04->
                      super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                      ).
                      super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>.
                      scanner,compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_68);
        }
      }
    }
    else {
      setup.lastOcc[3] = this->length - 1;
      if (((pat[(uint)(setup.lastOcc[3] * 4)] == pat[setup.lastOcc[3] * 4 + 1]) &&
          (pat[(uint)(setup.lastOcc[3] * 4)] == pat[setup.lastOcc[3] * 4 + 2])) &&
         (pat[(uint)(setup.lastOcc[3] * 4)] == pat[setup.lastOcc[3] * 4 + 3])) {
        this_00 = (SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *)
                  Compiler::Emit(compiler,0x449);
        SyncToLiteralEquivTrivialLastPatCharAndConsumeInst::
        SyncToLiteralEquivTrivialLastPatCharAndConsumeInst(this_00,this->offset,this->length);
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_00->
                    super_SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>).
                    super_EquivScannerMixinT<1U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                   pat,this->length,4);
      }
      else {
        this_01 = (SyncToLiteralEquivAndConsumeInst *)Compiler::Emit(compiler,0x449);
        SyncToLiteralEquivAndConsumeInst::SyncToLiteralEquivAndConsumeInst
                  (this_01,this->offset,this->length);
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_01->
                    super_SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>).
                    super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                   pat,this->length,4);
      }
    }
    this_local._4_4_ = this->length;
  }
  else {
    bVar2 = CountDomain::IsExact(&(this->super_Node).prevConsumes,0);
    if (bVar2) {
      if ((this->isEquivClass & 1U) == 0) {
        if (this->length == 1) {
          this_08 = (SyncToCharAndContinueInst *)Compiler::Emit(compiler,3);
          SyncToCharAndContinueInst::SyncToCharAndContinueInst(this_08,*pat);
        }
        else if (this->length == 2) {
          this_09 = (SyncToChar2LiteralAndContinueInst *)Compiler::Emit(compiler,5);
          SyncToChar2LiteralAndContinueInst::SyncToChar2LiteralAndContinueInst(this_09,*pat,pat[1]);
        }
        else {
          TextbookBoyerMooreSetup<char16_t>::TextbookBoyerMooreSetup
                    ((TextbookBoyerMooreSetup<char16_t> *)local_a0,pat,this->length);
          SVar3 = TextbookBoyerMooreSetup<char16_t>::GetScheme
                            ((TextbookBoyerMooreSetup<char16_t> *)local_a0);
          if (SVar3 == DefaultScheme) {
            this_11 = (SyncToLiteralAndContinueInst *)Compiler::Emit(compiler,0x449);
            SyncToLiteralAndContinueInst::SyncToLiteralAndContinueInst
                      (this_11,this->offset,this->length);
            TextbookBoyerMoore<char16_t>::Setup
                      (&(this_11->
                        super_SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                        ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.scanner,
                       compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_a0);
          }
          else if (SVar3 == LinearScheme) {
            this_10 = (SyncToLinearLiteralAndContinueInst *)Compiler::Emit(compiler,0x39);
            SyncToLinearLiteralAndContinueInst::SyncToLinearLiteralAndContinueInst
                      (this_10,this->offset,this->length);
            TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                      (&(this_10->
                        super_SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                        ).
                        super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>
                        .scanner,compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_a0
                      );
          }
        }
      }
      else {
        setup_1.lastOcc[3] = this->length - 1;
        if (((pat[(uint)(setup_1.lastOcc[3] * 4)] == pat[setup_1.lastOcc[3] * 4 + 1]) &&
            (pat[(uint)(setup_1.lastOcc[3] * 4)] == pat[setup_1.lastOcc[3] * 4 + 2])) &&
           (pat[(uint)(setup_1.lastOcc[3] * 4)] == pat[setup_1.lastOcc[3] * 4 + 3])) {
          this_06 = (SyncToLiteralEquivTrivialLastPatCharAndContinueInst *)
                    Compiler::Emit(compiler,0x449);
          SyncToLiteralEquivTrivialLastPatCharAndContinueInst::
          SyncToLiteralEquivTrivialLastPatCharAndContinueInst(this_06,this->offset,this->length);
          TextbookBoyerMoore<char16_t>::Setup
                    (&(this_06->
                      super_SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>).
                      super_EquivScannerMixinT<1U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                     pat,this->length,4);
        }
        else {
          this_07 = (SyncToLiteralEquivAndContinueInst *)Compiler::Emit(compiler,0x449);
          SyncToLiteralEquivAndContinueInst::SyncToLiteralEquivAndContinueInst
                    (this_07,this->offset,this->length);
          TextbookBoyerMoore<char16_t>::Setup
                    (&(this_07->
                      super_SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>).
                      super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                     pat,this->length,4);
        }
      }
    }
    else if ((this->isEquivClass & 1U) == 0) {
      if (this->length == 1) {
        this_14 = (SyncToCharAndBackupInst *)Compiler::Emit(compiler,0xb);
        SyncToCharAndBackupInst::SyncToCharAndBackupInst
                  (this_14,*pat,&(this->super_Node).prevConsumes);
      }
      else if (this->length == 2) {
        this_15 = (SyncToChar2LiteralAndBackupInst *)Compiler::Emit(compiler,0xd);
        SyncToChar2LiteralAndBackupInst::SyncToChar2LiteralAndBackupInst
                  (this_15,*pat,pat[1],&(this->super_Node).prevConsumes);
      }
      else {
        TextbookBoyerMooreSetup<char16_t>::TextbookBoyerMooreSetup
                  ((TextbookBoyerMooreSetup<char16_t> *)local_d8,pat,this->length);
        SVar3 = TextbookBoyerMooreSetup<char16_t>::GetScheme
                          ((TextbookBoyerMooreSetup<char16_t> *)local_d8);
        if (SVar3 == DefaultScheme) {
          this_17 = (SyncToLiteralAndBackupInst *)Compiler::Emit(compiler,0x451);
          SyncToLiteralAndBackupInst::SyncToLiteralAndBackupInst
                    (this_17,this->offset,this->length,&(this->super_Node).prevConsumes);
          TextbookBoyerMoore<char16_t>::Setup
                    (&(this_17->
                      super_SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                      ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.scanner,
                     compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_d8);
        }
        else if (SVar3 == LinearScheme) {
          this_16 = (SyncToLinearLiteralAndBackupInst *)Compiler::Emit(compiler,0x41);
          SyncToLinearLiteralAndBackupInst::SyncToLinearLiteralAndBackupInst
                    (this_16,this->offset,this->length,&(this->super_Node).prevConsumes);
          TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                    (&(this_16->
                      super_SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                      ).
                      super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>.
                      scanner,compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_d8);
        }
      }
    }
    else {
      setup_2.lastOcc[3] = this->length - 1;
      if (((pat[(uint)(setup_2.lastOcc[3] * 4)] == pat[setup_2.lastOcc[3] * 4 + 1]) &&
          (pat[(uint)(setup_2.lastOcc[3] * 4)] == pat[setup_2.lastOcc[3] * 4 + 2])) &&
         (pat[(uint)(setup_2.lastOcc[3] * 4)] == pat[setup_2.lastOcc[3] * 4 + 3])) {
        this_12 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)
                  Compiler::Emit(compiler,0x451);
        SyncToLiteralEquivTrivialLastPatCharAndBackupInst::
        SyncToLiteralEquivTrivialLastPatCharAndBackupInst
                  (this_12,this->offset,this->length,&(this->super_Node).prevConsumes);
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_12->
                    super_SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>).
                    super_EquivScannerMixinT<1U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                   pat,this->length,4);
      }
      else {
        this_13 = (SyncToLiteralEquivAndBackupInst *)Compiler::Emit(compiler,0x451);
        SyncToLiteralEquivAndBackupInst::SyncToLiteralEquivAndBackupInst
                  (this_13,this->offset,this->length,&(this->super_Node).prevConsumes);
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_13->
                    super_SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>).
                    super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner,compiler->rtAllocator,
                   pat,this->length,4);
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

CharCount MatchLiteralNode::EmitScan(Compiler& compiler, bool isHeadSyncronizingNode)
    {
        //
        // Compilation scheme:
        //
        //   SyncTo(Literal|LiteralEquiv|LinearLiteral)And(Continue|Consume|Backup)
        //

        Char * litptr = compiler.program->rep.insts.litbuf + offset;

        if (isHeadSyncronizingNode)
        {
            // For a head literal there's no need to back up after finding the literal, so use a faster instruction
            Assert(prevConsumes.IsExact(0)); // there should not be any consumes before this node
            if (isEquivClass)
            {
                const uint lastPatCharIndex = length - 1;
                if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                {
                    EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
                else
                {
                    EMIT(compiler, SyncToLiteralEquivAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
            }
            else if (length == 1)
                EMIT(compiler, SyncToCharAndConsumeInst, litptr[0]);
            else if (length == 2)
                EMIT(compiler, SyncToChar2LiteralAndConsumeInst, litptr[0], litptr[1]);
            else
            {
                TextbookBoyerMooreSetup<char16> setup(litptr, length);
                switch (setup.GetScheme())
                {
                case TextbookBoyerMooreSetup<char16>::LinearScheme:
                    EMIT(compiler, SyncToLinearLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                    EMIT(compiler, SyncToLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                };
            }
            return length;
        }
        else
        {
            // We're synchronizing on a non-head literal so we may need to back up. Or if we're syncing to the first literal
            // inside a group for instance, then we won't need to back up but we cannot consume the literal.
            if (prevConsumes.IsExact(0))
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndContinueInst, litptr[0]);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndContinueInst, litptr[0], litptr[1]);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            else
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndBackupInst, litptr[0], prevConsumes);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndBackupInst, litptr[0], litptr[1], prevConsumes);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            return 0;
        }
    }